

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase165::run(TestCase165 *this)

{
  PromiseNode *pPVar1;
  __pid_t _Var2;
  TransformPromiseNodeBase *pTVar3;
  Own<kj::_::ChainPromiseNode> OVar4;
  Promise<int> promise2;
  Promise<int> promise;
  WaitScope waitScope;
  EventLoop loop;
  Own<kj::_::PromiseNode> local_a8;
  Promise<int> local_98;
  _func_int *local_88;
  TransformPromiseNodeBase *local_80;
  Own<kj::_::PromiseNode> local_78;
  Own<kj::_::PromiseNode> local_68;
  EventLoop *local_58;
  undefined4 local_50;
  EventLoop local_48;
  
  EventLoop::EventLoop(&local_48);
  local_50 = 0xffffffff;
  local_58 = &local_48;
  EventLoop::enterScope(&local_48);
  _::yield();
  pTVar3 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar3,&local_a8,
             _::
             TransformPromiseNode<int,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:169:36),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  pPVar1 = local_a8.ptr;
  (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00434770;
  local_78.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::_::Void,kj::(anonymous_namespace)::TestCase165::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_78.ptr = (PromiseNode *)pTVar3;
  if (local_a8.ptr != (PromiseNode *)0x0) {
    local_a8.ptr = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_a8.disposer._4_4_,local_a8.disposer._0_4_))
              ((undefined8 *)CONCAT44(local_a8.disposer._4_4_,local_a8.disposer._0_4_),
               pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  _::yield();
  pTVar3 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar3,&local_a8,
             _::
             TransformPromiseNode<int,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:170:37),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  pPVar1 = local_a8.ptr;
  (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_004347f8;
  local_88 = (_func_int *)
             &_::
              HeapDisposer<kj::_::TransformPromiseNode<int,kj::_::Void,kj::(anonymous_namespace)::TestCase165::run()::$_1,kj::_::PropagateException>>
              ::instance;
  local_80 = pTVar3;
  if (local_a8.ptr != (PromiseNode *)0x0) {
    local_a8.ptr = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_a8.disposer._4_4_,local_a8.disposer._0_4_))
              ((undefined8 *)CONCAT44(local_a8.disposer._4_4_,local_a8.disposer._0_4_),
               pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  pTVar3 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar3,&local_78,
             _::
             TransformPromiseNode<kj::Promise<int>,_int,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:172:32),_kj::_::PropagateException>
             ::anon_class_8_1_ac918ff5_for_func::operator());
  (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00434880;
  pTVar3[1].super_PromiseNode._vptr_PromiseNode = &local_88;
  local_68.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<int>,int,kj::(anonymous_namespace)::TestCase165::run()::$_2,kj::_::PropagateException>>
        ::instance;
  local_68.ptr = (PromiseNode *)pTVar3;
  OVar4 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_a8,&local_68);
  pPVar1 = local_68.ptr;
  local_98.super_PromiseBase.node.disposer._0_4_ = local_a8.disposer._0_4_;
  local_98.super_PromiseBase.node.disposer._4_4_ = local_a8.disposer._4_4_;
  local_98.super_PromiseBase.node.ptr = local_a8.ptr;
  if ((TransformPromiseNodeBase *)local_68.ptr != (TransformPromiseNodeBase *)0x0) {
    local_68.ptr = (PromiseNode *)0x0;
    (**(local_68.disposer)->_vptr_Disposer)
              (local_68.disposer,
               ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode,OVar4.ptr);
  }
  _Var2 = Promise<int>::wait(&local_98,&local_58);
  if ((_Var2 != 0x1bc) && (_::Debug::minSeverity < 3)) {
    local_a8.disposer._0_4_ = 0x1bc;
    _Var2 = Promise<int>::wait(&local_98,&local_58);
    local_68.disposer = (Disposer *)CONCAT44(local_68.disposer._4_4_,_Var2);
    _::Debug::log<char_const(&)[53],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0xb2,ERROR,
               "\"failed: expected \" \"(444) == (promise3.wait(waitScope))\", 444, promise3.wait(waitScope)"
               ,(char (*) [53])"failed: expected (444) == (promise3.wait(waitScope))",
               (int *)&local_a8,(int *)&local_68);
  }
  pPVar1 = local_98.super_PromiseBase.node.ptr;
  if (local_98.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
    local_98.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_98.super_PromiseBase.node.disposer._4_4_,
                         local_98.super_PromiseBase.node.disposer._0_4_))
              ((undefined8 *)
               CONCAT44(local_98.super_PromiseBase.node.disposer._4_4_,
                        local_98.super_PromiseBase.node.disposer._0_4_),
               pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  pTVar3 = local_80;
  if (local_80 != (TransformPromiseNodeBase *)0x0) {
    local_80 = (TransformPromiseNodeBase *)0x0;
    (*(code *)**(undefined8 **)local_88)
              (local_88,(pTVar3->super_PromiseNode)._vptr_PromiseNode[-2] +
                        (long)&(pTVar3->super_PromiseNode)._vptr_PromiseNode);
  }
  pPVar1 = local_78.ptr;
  if ((TransformPromiseNodeBase *)local_78.ptr != (TransformPromiseNodeBase *)0x0) {
    local_78.ptr = (PromiseNode *)0x0;
    (**(local_78.disposer)->_vptr_Disposer)
              (local_78.disposer,
               ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
  }
  EventLoop::leaveScope(local_58);
  EventLoop::~EventLoop(&local_48);
  return;
}

Assistant:

TEST(Async, Chain) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<int> promise = evalLater([&]() -> int { return 123; });
  Promise<int> promise2 = evalLater([&]() -> int { return 321; });

  auto promise3 = promise.then([&](int i) {
    return promise2.then([i](int j) {
      return i + j;
    });
  });

  EXPECT_EQ(444, promise3.wait(waitScope));
}